

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_Parse_Taproot_xpubkey_Test::TestBody(Descriptor_Parse_Taproot_xpubkey_Test *this)

{
  bool bVar1;
  char *in_R9;
  char *pcVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertionResult gtest_ar_3;
  AssertHelper local_910;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_nums;
  SchnorrPubkey pubkey;
  string desc_str;
  string descriptor1;
  AssertionResult gtest_ar;
  string pubkey_hex;
  Script locking_script;
  DescriptorScriptReference script_ref;
  Descriptor desc;
  
  std::__cxx11::string::string
            ((string *)&pubkey_hex,
             "8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816",
             (allocator *)&script_ref);
  std::__cxx11::string::string
            ((string *)&descriptor1,
             "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*)"
             ,(allocator *)&script_ref);
  cfd::core::Descriptor::Descriptor(&desc);
  cfd::core::Script::Script(&locking_script);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&desc_str,"",(allocator *)&script_ref);
  cfd::core::DescriptorScriptReference::DescriptorScriptReference(&script_ref);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&pubkey);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar,&descriptor1,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=(&desc,(Descriptor *)&gtest_ar);
  cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&gtest_ar);
  std::__cxx11::string::string((string *)&gtest_ar,"1",(allocator *)&gtest_ar_);
  __l._M_len = 1;
  __l._M_array = (iterator)&gtest_ar;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&child_nums,__l,(allocator_type *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference((DescriptorScriptReference *)&gtest_ar,&desc,&child_nums);
      cfd::core::DescriptorScriptReference::operator=
                (&script_ref,(DescriptorScriptReference *)&gtest_ar);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x439,
               "Expected: script_ref = desc.GetReference(&child_nums) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = cfd::core::DescriptorScriptReference::HasKey(&script_ref);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"script_ref.HasKey()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_910,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::DescriptorScriptReference::HasAddress(&script_ref);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_910,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  gtest_ar_3._0_4_ = cfd::core::DescriptorScriptReference::GetKeyNum(&script_ref);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"1","script_ref.GetKeyNum()",(int *)&gtest_ar_,
             (uint *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild(&script_ref);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = !bVar1;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"script_ref.HasChild()"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_910,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum(&script_ref);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_910,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript(&script_ref);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_910,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::DescriptorScriptReference::HasScriptTree(&script_ref);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"script_ref.HasScriptTree()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x440,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_910,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript((Script *)&gtest_ar,&desc,&child_nums);
      cfd::core::Script::operator=(&locking_script,(Script *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x441,
               "Expected: locking_script = desc.GetLockingScript(child_nums) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_((string *)&gtest_ar,&desc,false);
      std::__cxx11::string::operator=((string *)&desc_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x442,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  gtest_ar_3._0_4_ = cfd::core::DescriptorScriptReference::GetAddressType(&script_ref);
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar,"AddressType::kTaprootAddress","script_ref.GetAddressType()",
             (AddressType *)&gtest_ar_,(AddressType *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x443,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  gtest_ar_3._0_4_ = cfd::core::DescriptorScriptReference::GetHashType(&script_ref);
  testing::internal::CmpHelperEQ<cfd::core::HashType,cfd::core::HashType>
            ((internal *)&gtest_ar,"HashType::kTaproot","script_ref.GetHashType()",
             (HashType *)&gtest_ar_,(HashType *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x444,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::DescriptorScriptReference::GenerateAddress((Address *)&gtest_ar,&script_ref,kMainnet);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_,(Address *)&gtest_ar);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"script_ref.GenerateAddress(nettype).GetAddress().c_str()",
             "\"bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj\"",
             (char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_),
             "bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj");
  std::__cxx11::string::~string((string *)&gtest_ar_);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x446,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)&gtest_ar_,&script_ref);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey
                ((SchnorrPubkey *)&gtest_ar,
                 (DescriptorKeyReference *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 *)&gtest_ar_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x447,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"desc_str.c_str()","descriptor1.c_str()",
             desc_str._M_dataplus._M_p,descriptor1._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x448,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar,&locking_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"locking_script.ToString().c_str()",
             "\"1 acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "1 acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x44a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&gtest_ar,&pubkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),pubkey_hex._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,1099,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&child_nums);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&script_ref);
  std::__cxx11::string::~string((string *)&desc_str);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  std::__cxx11::string::~string((string *)&descriptor1);
  std::__cxx11::string::~string((string *)&pubkey_hex);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_xpubkey) {
  std::string pubkey_hex = "8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816";
  std::string descriptor1 = "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kMainnet;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> child_nums = {"1"};

  EXPECT_NO_THROW(script_ref = desc.GetReference(&child_nums));
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript(child_nums));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48");
  EXPECT_STREQ(pubkey.GetHex().c_str(), pubkey_hex.c_str());
}